

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O1

void bashPrgDecrStep(void *buf,size_t count,void *state)

{
  octet *block;
  size_t count_00;
  ulong count_01;
  void *pvVar1;
  
  count_00 = *(long *)((long)state + 0xd0) - *(long *)((long)state + 0xd8);
  block = (octet *)((long)state + 0x10);
  pvVar1 = (void *)((long)state + *(long *)((long)state + 0xd8) + 0x10);
  if (count < count_00) {
    memXor2(buf,pvVar1,count);
    memXor2(block + *(long *)((long)state + 0xd8),buf,count);
    *(long *)((long)state + 0xd8) = *(long *)((long)state + 0xd8) + count;
  }
  else {
    memXor2(buf,pvVar1,count_00);
    memXor2(block + *(long *)((long)state + 0xd8),buf,
            *(long *)((long)state + 0xd0) - *(long *)((long)state + 0xd8));
    pvVar1 = (void *)((long)buf + (*(long *)((long)state + 0xd0) - *(long *)((long)state + 0xd8)));
    count_01 = (count - *(long *)((long)state + 0xd0)) + *(long *)((long)state + 0xd8);
    while( true ) {
      bashF(block,(void *)((long)state + 0x1a0));
      if (count_01 < *(ulong *)((long)state + 0xd0)) break;
      memXor2(pvVar1,block,*(ulong *)((long)state + 0xd0));
      memXor2(block,pvVar1,*(size_t *)((long)state + 0xd0));
      pvVar1 = (void *)((long)pvVar1 + *(long *)((long)state + 0xd0));
      count_01 = count_01 - *(long *)((long)state + 0xd0);
    }
    *(ulong *)((long)state + 0xd8) = count_01;
    if (count_01 != 0) {
      memXor2(pvVar1,block,count_01);
      memXor2(block,pvVar1,count_01);
      return;
    }
  }
  return;
}

Assistant:

void bashPrgDecrStep(void* buf, size_t count, void* state)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), buf, count));
	// остатка буфера достаточно?
	if (count < st->buf_len - st->pos)
	{
		memXor2(buf, st->s + st->pos, count);
		memXor2(st->s + st->pos, buf, count);
		st->pos += count;
		return;
	}
	// новый буфер
	memXor2(buf, st->s + st->pos, st->buf_len - st->pos);
	memXor2(st->s + st->pos, buf, st->buf_len - st->pos);
	buf = (octet*)buf + st->buf_len - st->pos;
	count -= st->buf_len - st->pos;
	bashF(st->s, st->stack);
	// цикл по полным блокам
	while (count >= st->buf_len)
	{
		memXor2(buf, st->s, st->buf_len);
		memXor2(st->s, buf, st->buf_len);
		buf = (octet*)buf + st->buf_len;
		count -= st->buf_len;
		bashF(st->s, st->stack);
	}
	// неполный блок
	if (st->pos = count)
	{
		memXor2(buf, st->s, count);
		memXor2(st->s, buf, count);
	}
}